

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

vector<Point_d,_std::allocator<Point_d>_> * __thiscall
Sampler::sample_rand_points
          (vector<Point_d,_std::allocator<Point_d>_> *__return_storage_ptr__,Sampler *this)

{
  long lVar1;
  int iVar2;
  int i;
  int x;
  int iVar3;
  undefined1 local_78 [8];
  Point_d pix;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> not_sampled_yet;
  
  std::operator<<((ostream *)&std::cout,"sampling random points\n");
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pix.id = 0;
  pix._28_4_ = 0;
  not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  for (iVar3 = 0; iVar3 < this->_X; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < this->_Y; iVar2 = iVar2 + 1) {
      local_78._4_4_ = iVar2;
      local_78._0_4_ = iVar3;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&pix.id,
                 (pair<int,_int> *)local_78);
    }
  }
  Point_d::Point_d((Point_d *)local_78,999999.0,99999.0,99999.0,9999999);
  for (iVar3 = 0; iVar3 < this->_Amount; iVar3 = iVar3 + 1) {
    iVar2 = rand();
    lVar1 = (long)(int)((ulong)(long)iVar2 %
                       (ulong)((long)not_sampled_yet.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - pix._24_8_ >> 3));
    local_78 = (undefined1  [8])(double)*(int *)(pix._24_8_ + lVar1 * 8);
    pix.x = (double)*(int *)(pix._24_8_ + 4 + lVar1 * 8);
    *(int *)(pix._24_8_ + lVar1 * 8) =
         not_sampled_yet.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[-1].first;
    *(int *)(pix._24_8_ + 4 + lVar1 * 8) =
         not_sampled_yet.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[-1].second;
    pix.dis._0_4_ = iVar3;
    std::vector<Point_d,_std::allocator<Point_d>_>::push_back
              (__return_storage_ptr__,(value_type *)local_78);
    not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         not_sampled_yet.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&pix.id);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point_d> sample_rand_points(){
      std::cout<<"sampling random points\n";
      std::vector<Point_d> output_pattern;

      //PREPARE:
      std::vector<std::pair<int, int> > not_sampled_yet;
      for(int x=0; x<_X; x++)
      {
        for(int y=0; y<_Y; y++)
        {
          not_sampled_yet.push_back(std::pair<int,int>(x,y));
        }
      }
      //SAMPLING
      Point_d pix;
      for (int i=0; i<_Amount; i++)
      {
        //std::cout<<i<<"\n";
        int n= rand()% not_sampled_yet.size();
        pix.x= (double)not_sampled_yet[n].first;
        pix.y= (double)not_sampled_yet[n].second;
        pix.id = i;
        not_sampled_yet[n]=not_sampled_yet.back();
        not_sampled_yet.pop_back();
        output_pattern.push_back(pix);
      }
      return output_pattern;

    }